

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::Image::ImageTargetGLES2::iterate(ImageTargetGLES2 *this)

{
  CallLogWrapper *this_00;
  EGLConfig *ppvVar1;
  TestLog *pTVar2;
  EGLDisplay display;
  TestContext *this_01;
  bool bVar3;
  EGLint EVar4;
  GLenum GVar5;
  int iVar6;
  uint returnValue;
  Library *pLVar7;
  GLubyte *__s;
  long lVar8;
  undefined4 extraout_var;
  void *image;
  NotSupportedError *this_02;
  long *plVar9;
  TestError *this_03;
  EglTestContext *pEVar10;
  pointer_____offset_0x10___ *ppuVar11;
  deUint32 srcTex;
  Library *local_1c40;
  EGLint attribs [3];
  deUint32 dstTex;
  undefined4 uStack_1c24;
  ostringstream local_1c20 [8];
  TestLog local_1c18 [13];
  ios_base local_1bb0 [264];
  Context context;
  
  local_1c40 = EglTestContext::getLibrary((this->super_ImageTestCase).super_TestCase.m_eglTestCtx);
  pTVar2 = ((this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  pLVar7 = EglTestContext::getLibrary((this->super_ImageTestCase).super_TestCase.m_eglTestCtx);
  display = (this->super_ImageTestCase).m_display;
  ppvVar1 = &context.m_config;
  context.m_eglTestCtx = (EglTestContext *)ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context,"EGL_KHR_gl_texture_2D_image","");
  bVar3 = eglu::hasExtension(pLVar7,display,(string *)&context);
  if (context.m_eglTestCtx != (EglTestContext *)ppvVar1) {
    operator_delete(context.m_eglTestCtx,(long)context.m_config + 1);
  }
  if (bVar3) {
    tcu::TestContext::setTestResult
              ((this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
    Context::Context(&context,(this->super_ImageTestCase).super_TestCase.m_eglTestCtx,
                     (this->super_ImageTestCase).m_display,(ContextType)0x2,0x40,0x40);
    _dstTex = pTVar2;
    std::__cxx11::ostringstream::ostringstream(local_1c20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c20,"Using EGL config ",0x11);
    pLVar7 = EglTestContext::getLibrary((this->super_ImageTestCase).super_TestCase.m_eglTestCtx);
    EVar4 = eglu::getConfigID(pLVar7,context.m_display,context.m_config);
    std::ostream::operator<<(local_1c20,EVar4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&dstTex,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1c20);
    std::ios_base::~ios_base(local_1bb0);
    this_00 = &(this->super_ImageTestCase).super_CallLogWrapper;
    __s = glu::CallLogWrapper::glGetString(this_00,0x1f03);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dstTex,(char *)__s,(allocator<char> *)attribs);
    lVar8 = std::__cxx11::string::find((char *)&dstTex,0x1b94e60,0);
    if (_dstTex != local_1c18) {
      operator_delete(_dstTex,(ulong)((long)&(local_1c18[0].m_log)->flags + 1));
    }
    if (lVar8 == -1) {
      this_03 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                ((NotSupportedError *)this_03,"Extension not supported","GL_OES_EGL_image",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                 ,0x1b8);
      ppuVar11 = &tcu::NotSupportedError::typeinfo;
    }
    else {
      if ((this->super_ImageTestCase).m_gl.eglImageTargetTexture2DOES ==
          (glEGLImageTargetTexture2DOESFunc)0x0) {
        this_03 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_03,(char *)0x0,"m_gl.eglImageTargetTexture2DOES",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                   ,0x1ba);
      }
      else {
        if ((this->super_ImageTestCase).m_gl.eglImageTargetRenderbufferStorageOES !=
            (glEGLImageTargetRenderbufferStorageOESFunc)0x0) {
          _dstTex = pTVar2;
          std::__cxx11::ostringstream::ostringstream(local_1c20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c20,
                     "Creating EGLImage using GL_TEXTURE_2D with GL_RGBA storage",0x3a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&dstTex,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1c20);
          std::ios_base::~ios_base(local_1bb0);
          srcTex = 1;
          glu::CallLogWrapper::glBindTexture(this_00,0xde1,1);
          GVar5 = glu::CallLogWrapper::glGetError(this_00);
          glu::checkError(GVar5,"glBindTexture(GL_TEXTURE_2D, srcTex)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                          ,0x1c2);
          glu::CallLogWrapper::glTexImage2D
                    (this_00,0xde1,0,0x1908,0x40,0x40,0,0x1908,0x1401,(void *)0x0);
          GVar5 = glu::CallLogWrapper::glGetError(this_00);
          glu::checkError(GVar5,
                          "glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                          ,0x1c3);
          glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
          GVar5 = glu::CallLogWrapper::glGetError(this_00);
          glu::checkError(GVar5,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                          ,0x1c4);
          attribs[2] = 0x3038;
          attribs[0] = 0x30bc;
          attribs[1] = 0;
          pEVar10 = (this->super_ImageTestCase).super_TestCase.m_eglTestCtx;
          iVar6 = (*local_1c40->_vptr_Library[8])
                            (local_1c40,context.m_display,context.m_context.m_context,0x30b1,1);
          image = checkCallError<void*>
                            (pEVar10,
                             "egl.createImageKHR(context.getEglDisplay(), context.getEglContext(), EGL_GL_TEXTURE_2D_KHR, (EGLClientBuffer)(deUintptr)srcTex, attribs)"
                             ,(void *)CONCAT44(extraout_var,iVar6),0x3000);
          if (image == (void *)0x0) {
            _dstTex = pTVar2;
            std::__cxx11::ostringstream::ostringstream(local_1c20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c20,"  Fail: Got EGL_NO_IMAGE_KHR!",0x1d);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&dstTex,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1c20);
            std::ios_base::~ios_base(local_1bb0);
            this_01 = (this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx;
            if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Got EGL_NO_IMAGE_KHR");
            }
          }
          if (this->m_target == 0xde1) {
            _dstTex = pTVar2;
            std::__cxx11::ostringstream::ostringstream(local_1c20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c20,"Creating GL_TEXTURE_2D from EGLimage",0x24);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&dstTex,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1c20);
            std::ios_base::~ios_base(local_1bb0);
            _dstTex = (TestLog *)CONCAT44(uStack_1c24,2);
            glu::CallLogWrapper::glBindTexture(this_00,0xde1,2);
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,"glBindTexture(GL_TEXTURE_2D, dstTex)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                            ,0x1d7);
            glu::CallLogWrapper::glEGLImageTargetTexture2DOES(this_00,0xde1,image);
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,
                            "glEGLImageTargetTexture2DOES(GL_TEXTURE_2D, (GLeglImageOES)image)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                            ,0x1d8);
            glu::CallLogWrapper::glDeleteTextures(this_00,1,&dstTex);
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,"glDeleteTextures(1, &dstTex)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                            ,0x1d9);
          }
          else {
            _dstTex = pTVar2;
            std::__cxx11::ostringstream::ostringstream(local_1c20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c20,"Creating GL_RENDERBUFFER from EGLimage",0x26);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&dstTex,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1c20);
            std::ios_base::~ios_base(local_1bb0);
            _dstTex = (TestLog *)CONCAT44(uStack_1c24,2);
            glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,2);
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,"glBindRenderbuffer(GL_RENDERBUFFER, dstRbo)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                            ,0x1e2);
            glu::CallLogWrapper::glEGLImageTargetRenderbufferStorageOES(this_00,0x8d41,image);
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,
                            "glEGLImageTargetRenderbufferStorageOES(GL_RENDERBUFFER, (GLeglImageOES)image)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                            ,0x1e3);
            glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&dstTex);
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,"glDeleteRenderbuffers(1, &dstRbo)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                            ,0x1e4);
          }
          pEVar10 = (this->super_ImageTestCase).super_TestCase.m_eglTestCtx;
          returnValue = (*local_1c40->_vptr_Library[0x15])(local_1c40,context.m_display,image);
          checkCallReturn<unsigned_int>
                    (pEVar10,"egl.destroyImageKHR(context.getEglDisplay(), image)",returnValue,1,
                     0x3000);
          glu::CallLogWrapper::glDeleteTextures(this_00,1,&srcTex);
          GVar5 = glu::CallLogWrapper::glGetError(this_00);
          glu::checkError(GVar5,"glDeleteTextures(1, &srcTex)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                          ,0x1eb);
          eglu::ScopedCurrentContext::~ScopedCurrentContext(&context.m_current);
          if (context.m_surface.
              super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
              .m_data.ptr != (ManagedSurface *)0x0) {
            (*(context.m_surface.
               super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
               .m_data.ptr)->_vptr_ManagedSurface[1])();
            context.m_surface.
            super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
            .m_data.ptr = (ManagedSurface *)0x0;
          }
          eglu::UniqueContext::~UniqueContext(&context.m_context);
          return STOP;
        }
        this_03 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_03,(char *)0x0,"m_gl.eglImageTargetRenderbufferStorageOES",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                   ,0x1bb);
      }
      ppuVar11 = &tcu::TestError::typeinfo;
    }
    __cxa_throw(this_03,ppuVar11,tcu::Exception::~Exception);
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  _dstTex = local_1c18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dstTex,"Unsupported extension: ","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&dstTex);
  context.m_eglTestCtx = (EglTestContext *)*plVar9;
  pEVar10 = (EglTestContext *)(plVar9 + 2);
  if (context.m_eglTestCtx == pEVar10) {
    context.m_config = pEVar10->m_testCtx;
    context.m_context.m_egl = (Library *)plVar9[3];
    context.m_eglTestCtx = (EglTestContext *)ppvVar1;
  }
  else {
    context.m_config = pEVar10->m_testCtx;
  }
  context.m_display = (EGLDisplay)plVar9[1];
  *plVar9 = (long)pEVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError
            (this_02,(char *)context.m_eglTestCtx,
             "eglu::hasExtension(m_eglTestCtx.getLibrary(), m_display, \"EGL_KHR_gl_texture_2D_image\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
             ,0x1a9);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		// \todo [2011-07-21 pyry] Try all possible EGLImage sources
		CHECK_EXTENSION(m_display, "EGL_KHR_gl_texture_2D_image");

		// Initialize result.
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		// Create GLES2 context

		Context context(m_eglTestCtx, m_display, ContextType(ApiType::es(2, 0)), 64, 64);
		log << TestLog::Message << "Using EGL config " << eglu::getConfigID(m_eglTestCtx.getLibrary(), context.getEglDisplay(), context.getConfig()) << TestLog::EndMessage;

		// Check for OES_EGL_image
		{
			const char* glExt = (const char*)glGetString(GL_EXTENSIONS);

			if (string(glExt).find("GL_OES_EGL_image") == string::npos)
				throw tcu::NotSupportedError("Extension not supported", "GL_OES_EGL_image", __FILE__, __LINE__);

			TCU_CHECK(m_gl.eglImageTargetTexture2DOES);
			TCU_CHECK(m_gl.eglImageTargetRenderbufferStorageOES);
		}

		// Create GL_TEXTURE_2D and EGLImage from it.
		log << TestLog::Message << "Creating EGLImage using GL_TEXTURE_2D with GL_RGBA storage" << TestLog::EndMessage;

		deUint32 srcTex = 1;
		GLU_CHECK_CALL(glBindTexture(GL_TEXTURE_2D, srcTex));
		GLU_CHECK_CALL(glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL));
		GLU_CHECK_CALL(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR));

		// Create EGL image
		EGLint		attribs[]	= { EGL_GL_TEXTURE_LEVEL_KHR, 0, EGL_NONE };
		EGLImageKHR	image		= CHECK_EXT_CALL_ERR(egl.createImageKHR(context.getEglDisplay(), context.getEglContext(), EGL_GL_TEXTURE_2D_KHR, (EGLClientBuffer)(deUintptr)srcTex, attribs), EGL_SUCCESS);
		if (image == EGL_NO_IMAGE_KHR)
		{
			log << TestLog::Message << "  Fail: Got EGL_NO_IMAGE_KHR!" << TestLog::EndMessage;

			if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got EGL_NO_IMAGE_KHR");
		}

		// Create texture or renderbuffer
		if (m_target == GL_TEXTURE_2D)
		{
			log << TestLog::Message << "Creating GL_TEXTURE_2D from EGLimage" << TestLog::EndMessage;

			deUint32 dstTex = 2;
			GLU_CHECK_CALL(glBindTexture(GL_TEXTURE_2D, dstTex));
			GLU_CHECK_CALL(glEGLImageTargetTexture2DOES(GL_TEXTURE_2D, (GLeglImageOES)image));
			GLU_CHECK_CALL(glDeleteTextures(1, &dstTex));
		}
		else
		{
			DE_ASSERT(m_target == GL_RENDERBUFFER);

			log << TestLog::Message << "Creating GL_RENDERBUFFER from EGLimage" << TestLog::EndMessage;

			deUint32 dstRbo = 2;
			GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, dstRbo));
			GLU_CHECK_CALL(glEGLImageTargetRenderbufferStorageOES(GL_RENDERBUFFER, (GLeglImageOES)image));
			GLU_CHECK_CALL(glDeleteRenderbuffers(1, &dstRbo));
		}

		// Destroy image
		CHECK_EXT_CALL_RET(egl.destroyImageKHR(context.getEglDisplay(), image), (EGLBoolean)EGL_TRUE, EGL_SUCCESS);

		// Destroy source texture object
		GLU_CHECK_CALL(glDeleteTextures(1, &srcTex));

		return STOP;
	}